

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O0

void __thiscall
winmd::reader::MethodDefSig::MethodDefSig(MethodDefSig *this,table_base *table,byte_view *data)

{
  uint uVar1;
  CallingConvention CVar2;
  uint32_t uVar3;
  uint32_t local_6c;
  uint local_58;
  uint32_t count;
  allocator<char> local_41;
  string local_40;
  byte_view *local_20;
  byte_view *data_local;
  table_base *table_local;
  MethodDefSig *this_local;
  
  local_20 = data;
  data_local = (byte_view *)table;
  table_local = (table_base *)this;
  CVar2 = uncompress_enum<winmd::reader::CallingConvention>(data);
  this->m_calling_convention = CVar2;
  CVar2 = enum_mask<winmd::reader::CallingConvention>(this->m_calling_convention,Generic);
  if (CVar2 == Generic) {
    local_6c = uncompress_unsigned(local_20);
  }
  else {
    local_6c = 0;
  }
  this->m_generic_param_count = local_6c;
  uVar3 = uncompress_unsigned(local_20);
  this->m_param_count = uVar3;
  RetTypeSig::RetTypeSig(&this->m_ret_type,(table_base *)data_local,local_20);
  cppwinrt::std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>::vector
            (&this->m_params);
  uVar1 = this->m_param_count;
  uVar3 = byte_view::size(local_20);
  if (uVar3 < uVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Invalid blob array size",&local_41);
    impl::throw_invalid(&local_40);
  }
  cppwinrt::std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>::reserve
            (&this->m_params,(ulong)this->m_param_count);
  for (local_58 = 0; local_58 < this->m_param_count; local_58 = local_58 + 1) {
    std::vector<winmd::reader::ParamSig,std::allocator<winmd::reader::ParamSig>>::
    emplace_back<winmd::reader::table_base_const*&,winmd::reader::byte_view&>
              ((vector<winmd::reader::ParamSig,std::allocator<winmd::reader::ParamSig>> *)
               &this->m_params,(table_base **)&data_local,local_20);
  }
  return;
}

Assistant:

MethodDefSig(table_base const* table, byte_view& data)
            : m_calling_convention(uncompress_enum<CallingConvention>(data))
            , m_generic_param_count(enum_mask(m_calling_convention, CallingConvention::Generic) == CallingConvention::Generic ? uncompress_unsigned(data) : 0)
            , m_param_count(uncompress_unsigned(data))
            , m_ret_type(table, data)
        {
            if (m_param_count > data.size())
            {
                impl::throw_invalid("Invalid blob array size");
            }
            m_params.reserve(m_param_count);
            for (uint32_t count = 0; count < m_param_count; ++count)
            {
                m_params.emplace_back(table, data);
            }
        }